

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayGenerateMipMap.cpp
# Opt level: O2

IterateResult __thiscall
glcts::TextureCubeMapArrayGenerateMipMapNonFilterable::iterate
          (TextureCubeMapArrayGenerateMipMapNonFilterable *this)

{
  ostringstream *this_00;
  pointer pSVar1;
  int iVar2;
  deUint32 err;
  uint uVar3;
  undefined4 extraout_var;
  long lVar5;
  TestError *this_01;
  undefined1 local_1b0 [384];
  long lVar4;
  
  initTest(this);
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  uVar3 = 0;
  do {
    pSVar1 = (this->m_non_filterable_texture_configs).
             super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl
             .super__Vector_impl_data._M_start;
    lVar5 = (long)(this->m_non_filterable_texture_configs).
                  super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pSVar1;
    if ((ulong)(lVar5 / 0x14) <= (ulong)uVar3) {
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
    (**(code **)(lVar4 + 0xb8))(0x9009,pSVar1[uVar3].m_to_id,lVar5 % 0x14);
    err = (**(code **)(lVar4 + 0x800))();
    glu::checkError(err,"glBindTexture() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayGenerateMipMap.cpp"
                    ,0x293);
    (**(code **)(lVar4 + 0x710))(0x9009);
    iVar2 = (**(code **)(lVar4 + 0x800))();
    uVar3 = uVar3 + 1;
  } while (iVar2 == 0x502);
  local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,
                  "glGenerateMipmap() operating on an non-filterable internalformat did not report GL_INVALID_OPERATION as per spec but "
                 );
  std::ostream::operator<<(this_00,iVar2);
  std::operator<<((ostream *)this_00," instead.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Invalid error code reported for an invalid glGenerateMipmap() call.",
             (char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayGenerateMipMap.cpp"
             ,0x2a1);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestCase::IterateResult TextureCubeMapArrayGenerateMipMapNonFilterable::iterate()
{
	/* Initialize ES objects used by the test */
	initTest();

	/* Verify that glGenerateMipmap() always throws GL_INVALID_OPERATION, if the
	 * texture object the call would operate on uses non-filterable internalformat.
	 */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	for (unsigned int n_storage_config = 0; n_storage_config < m_non_filterable_texture_configs.size();
		 ++n_storage_config)
	{
		gl.bindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, m_non_filterable_texture_configs[n_storage_config].m_to_id);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

		gl.generateMipmap(GL_TEXTURE_CUBE_MAP_ARRAY);

		/* What's the error code at this point? */
		int error_code = gl.getError();

		if (error_code != GL_INVALID_OPERATION)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "glGenerateMipmap() operating on an non-filterable internalformat "
								  "did not report GL_INVALID_OPERATION as per spec but "
							   << error_code << " instead." << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid error code reported for an invalid glGenerateMipmap() call.");
		}
	} /* for (all storage configs) */

	/* The test has passed */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}